

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCom.c
# Opt level: O2

int If_CommandReadLut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  If_LibLut_t *pLib;
  If_LibLut_t *pLutLib;
  char *pcVar3;
  
  Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  bVar1 = true;
  while (iVar2 = Extra_UtilGetopt(argc,argv,"vh"), iVar2 == 0x76) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if ((iVar2 == -1) && (globalUtilOptind + 1 == argc)) {
    pcVar3 = argv[globalUtilOptind];
    __stream_00 = fopen(pcVar3,"r");
    if (__stream_00 == (FILE *)0x0) {
      fprintf(__stream,"Cannot open input file \"%s\". ",pcVar3);
      pcVar3 = Extra_FileGetSimilarName(pcVar3,".genlib",".lib",".gen",".g",(char *)0x0);
      if (pcVar3 != (char *)0x0) {
        fprintf(__stream,"Did you mean \"%s\"?",pcVar3);
      }
      fputc(10,__stream);
      return 1;
    }
    fclose(__stream_00);
    pLib = If_LibLutRead(pcVar3);
    if (pLib != (If_LibLut_t *)0x0) {
      pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
      If_LibLutFree(pLutLib);
      Abc_FrameSetLibLut(pLib);
      return 0;
    }
    fwrite("Reading LUT library has failed.\n",0x20,1,__stream);
  }
  fwrite("\nusage: read_lut [-vh]\n",0x17,1,__stream);
  fwrite("\t          read the LUT library from the file\n",0x2e,1,__stream);
  pcVar3 = "yes";
  if (!bVar1) {
    pcVar3 = "no";
  }
  fprintf(__stream,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar3);
  fwrite("\t-h      : print the command usage\n",0x23,1,__stream);
  fwrite("\t                                        \n",0x2a,1,__stream);
  fwrite("\t          File format for a LUT library:\n",0x2a,1,__stream);
  fwrite("\t          (the default library is shown)\n",0x2a,1,__stream);
  fwrite("\t                                        \n",0x2a,1,__stream);
  fwrite("\t          # The area/delay of k-variable LUTs:\n",0x30,1,__stream);
  fwrite("\t          # k  area   delay\n",0x1d,1,__stream);
  fwrite("\t          1      1      1\n",0x1b,1,__stream);
  fwrite("\t          2      2      2\n",0x1b,1,__stream);
  fwrite("\t          3      4      3\n",0x1b,1,__stream);
  fwrite("\t          4      8      4\n",0x1b,1,__stream);
  fwrite("\t          5     16      5\n",0x1b,1,__stream);
  fwrite("\t          6     32      6\n",0x1b,1,__stream);
  return 1;
}

Assistant:

int If_CommandReadLut( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    If_LibLut_t * pLib;
    Abc_Ntk_t * pNet;
    char * FileName;
    int fVerbose;
    int c;

    pNet = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "vh")) != EOF ) 
    {
        switch (c) 
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
        goto usage;

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".genlib", ".lib", ".gen", ".g", NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", FileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pLib = If_LibLutRead( FileName );
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading LUT library has failed.\n" );
        goto usage;
    }
    // replace the current library
    If_LibLutFree( (If_LibLut_t *)Abc_FrameReadLibLut() );
    Abc_FrameSetLibLut( pLib );
    return 0;

usage:
    fprintf( pErr, "\nusage: read_lut [-vh]\n");
    fprintf( pErr, "\t          read the LUT library from the file\n" );  
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h      : print the command usage\n");
    fprintf( pErr, "\t                                        \n");
    fprintf( pErr, "\t          File format for a LUT library:\n");
    fprintf( pErr, "\t          (the default library is shown)\n");
    fprintf( pErr, "\t                                        \n");
    fprintf( pErr, "\t          # The area/delay of k-variable LUTs:\n");
    fprintf( pErr, "\t          # k  area   delay\n");
    fprintf( pErr, "\t          1      1      1\n");
    fprintf( pErr, "\t          2      2      2\n");
    fprintf( pErr, "\t          3      4      3\n");
    fprintf( pErr, "\t          4      8      4\n");
    fprintf( pErr, "\t          5     16      5\n");
    fprintf( pErr, "\t          6     32      6\n");
    return 1;       /* error exit */
}